

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

path * __thiscall boost::filesystem::path::imbue(path *this,locale *loc)

{
  anon_unknown.dwarf_1d6a5::path_locale();
  std::locale::locale((locale *)this,(locale *)&(anonymous_namespace)::path_locale()::loc);
  anon_unknown.dwarf_1d6a5::path_locale();
  std::locale::operator=((locale *)&(anonymous_namespace)::path_locale()::loc,loc);
  return this;
}

Assistant:

std::locale path::imbue(const std::locale& loc)
  {
#ifdef BOOST_FILESYSTEM_DEBUG
    std::cout << "***** path::imbue() called" << std::endl;
#endif
    std::locale temp(path_locale());
    path_locale() = loc;
    return temp;
  }